

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

void __thiscall rw::Skin::findNumWeights(Skin *this,int32 numVertices)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  
  this->numWeights = 1;
  if (numVertices != 0) {
    pfVar1 = this->weights;
    lVar2 = 1;
    do {
      numVertices = numVertices + -1;
      iVar3 = (int)lVar2;
      lVar2 = (long)iVar3;
      while( true ) {
        iVar3 = iVar3 + 1;
        if ((pfVar1[lVar2] == 0.0) && (!NAN(pfVar1[lVar2]))) break;
        lVar2 = lVar2 + 1;
        this->numWeights = iVar3;
        if ((int)lVar2 == 4) {
          return;
        }
      }
      pfVar1 = pfVar1 + 4;
    } while (numVertices != 0);
  }
  return;
}

Assistant:

void
Skin::findNumWeights(int32 numVertices)
{
	this->numWeights = 1;
	float *w = this->weights;
	while(numVertices--){
		while(w[this->numWeights] != 0.0f){
			this->numWeights++;
			if(this->numWeights == 4)
				return;
		}
		w += 4;
	}
}